

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::shrink
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *this,size_t newSize)

{
  if (newSize == 0) {
    this->numActive = 0;
    if (2 < this->numAllocated) {
      if (this->items != (pool_ref<soul::AST::Expression> *)0x0) {
        operator_delete__(this->items);
      }
      this->items = (pool_ref<soul::AST::Expression> *)this->space;
      this->numAllocated = 2;
    }
  }
  else {
    if (this->numActive < newSize) {
      throwInternalCompilerError("newSize <= numActive","shrink",0xff);
    }
    if (newSize < this->numActive) {
      this->numActive = newSize;
    }
  }
  return;
}

Assistant:

void shrink (size_t newSize)
    {
        if (newSize == 0)
            return clear();

        SOUL_ASSERT (newSize <= numActive);

        while (newSize < numActive && numActive > 0)
            items[--numActive].~Item();
    }